

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialJointPolicyPureVector.cpp
# Opt level: O0

void __thiscall
PartialJointPolicyPureVector::PartialJointPolicyPureVector
          (PartialJointPolicyPureVector *this,Interface_ProblemToPolicyDiscretePure *pu,
          PolicyDomainCategory idc,double pastReward,size_t depth)

{
  Interface_ProblemToPolicyDiscretePure *in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  PolicyDomainCategory idc_00;
  Interface_ProblemToPolicyDiscretePure *in_RDI;
  PartialJointPolicyDiscretePure *in_XMM0_Qa;
  JPolComponent_VectorImplementation *unaff_retaddr;
  double in_stack_ffffffffffffffc8;
  PolicyDomainCategory in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe8;
  Interface_ProblemToPolicyDiscretePure *pu_00;
  
  idc_00 = (PolicyDomainCategory)((ulong)in_RSI >> 0x20);
  pu_00 = in_RDI;
  PartialJointPolicyDiscretePure::PartialJointPolicyDiscretePure
            (in_XMM0_Qa,in_RCX,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
  JPolComponent_VectorImplementation::JPolComponent_VectorImplementation
            (unaff_retaddr,pu_00,idc_00,CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  (in_RDI->super_Interface_ProblemToPolicyDiscrete)._vptr_Interface_ProblemToPolicyDiscrete =
       (_func_int **)&PTR_operator__00d14630;
  in_RDI[8].super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete =
       (_func_int **)&DAT_00d14710;
  (*(in_RDI->super_Interface_ProblemToPolicyDiscrete)._vptr_Interface_ProblemToPolicyDiscrete[2])
            (in_RDI,in_RCX);
  return;
}

Assistant:

PartialJointPolicyPureVector::PartialJointPolicyPureVector(
    const Interface_ProblemToPolicyDiscretePure* pu,
    PolicyGlobals::PolicyDomainCategory idc,
    double pastReward,
    size_t depth) :
    PartialJointPolicyDiscretePure(pu, idc, pastReward),
    JPolComponent_VectorImplementation(pu, idc, depth)
{
    SetDepth(depth);
}